

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O1

void __thiscall cs::token_id::~token_id(token_id *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *in_RSI;
  
  pcVar2 = (this->mId).m_id._M_dataplus._M_p;
  paVar1 = &(this->mId).m_id.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    in_RSI = (void *)(paVar1->_M_allocated_capacity + 1);
    operator_delete(pcVar2,(ulong)in_RSI);
  }
  this_00 = (this->mId).m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  token_base::operator_delete(&this->super_token_base,in_RSI);
  return;
}

Assistant:

token_id() = delete;